

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenSwitchSetNameAt(BinaryenExpressionRef expr,BinaryenIndex index,char *name)

{
  Name *pNVar1;
  Name local_30;
  
  if (expr->_id != SwitchId) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x86e,
                  "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  if ((ulong)index < expr[1].type.id) {
    if (name != (char *)0x0) {
      wasm::Name::Name(&local_30,name);
      pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(expr + 1),
                          (ulong)index);
      (pNVar1->super_IString).str._M_len = local_30.super_IString.str._M_len;
      (pNVar1->super_IString).str._M_str = local_30.super_IString.str._M_str;
      return;
    }
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x870,
                  "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  __assert_fail("index < static_cast<Switch*>(expression)->targets.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x86f,
                "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)");
}

Assistant:

void BinaryenSwitchSetNameAt(BinaryenExpressionRef expr,
                             BinaryenIndex index,
                             const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(index < static_cast<Switch*>(expression)->targets.size());
  assert(name);
  static_cast<Switch*>(expression)->targets[index] = name;
}